

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# java_helpers.cc
# Opt level: O0

string * google::protobuf::compiler::java::JavaPackageToDir
                   (string *__return_storage_ptr__,string *package_name)

{
  ulong uVar1;
  allocator local_79;
  string local_78;
  allocator local_41;
  string local_40;
  undefined1 local_19;
  string *local_18;
  string *package_name_local;
  string *package_dir;
  
  local_19 = 0;
  local_18 = package_name;
  package_name_local = __return_storage_ptr__;
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_40,".",&local_41);
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_78,"/",&local_79);
  StringReplace(__return_storage_ptr__,package_name,&local_40,&local_78,true);
  std::__cxx11::string::~string((string *)&local_78);
  std::allocator<char>::~allocator((allocator<char> *)&local_79);
  std::__cxx11::string::~string((string *)&local_40);
  std::allocator<char>::~allocator((allocator<char> *)&local_41);
  uVar1 = std::__cxx11::string::empty();
  if ((uVar1 & 1) == 0) {
    std::__cxx11::string::operator+=((string *)__return_storage_ptr__,"/");
  }
  return __return_storage_ptr__;
}

Assistant:

std::string JavaPackageToDir(std::string package_name) {
  std::string package_dir = StringReplace(package_name, ".", "/", true);
  if (!package_dir.empty()) package_dir += "/";
  return package_dir;
}